

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void list_empty(list *list)

{
  clear_list(list,false);
  return;
}

Assistant:

void list_empty(struct list *list)
{
        clear_list(list, false);
}